

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

bool uWS::WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
     consumeMessage<8u,unsigned_short>
               (unsigned_short payLength,char **src,uint *length,WebSocketState<true> *wState,
               void *user)

{
  OpCode OVar1;
  bool bVar2;
  OpCode OVar3;
  byte bVar4;
  OpCode OVar5;
  uint uVar6;
  char *pcVar7;
  
  OVar5 = **src;
  OVar1 = *(OpCode *)&wState->state;
  OVar3 = OVar5 & 0xf;
  if (OVar3 == 0) {
    if ((OVar1 & 0x60) == 0x60) goto LAB_0016ae82;
  }
  else {
    if (((OVar1 & 0x60) == 0x20) || (OVar3 == TEXT && -1 < (char)OVar1)) goto LAB_0016ae82;
    bVar4 = (OVar1 >> 5) + 1;
    OVar1 = OVar1 & 0x9f | (bVar4 & 3) << 5;
    *(OpCode *)&wState->state = OVar1;
    (wState->state).opCode[(long)((ulong)bVar4 << 0x3e) >> 0x3e] = OVar3;
    OVar5 = **src;
  }
  *(OpCode *)&wState->state = OVar1 & 0x7f | OVar5 & 0x80;
  bVar2 = WebSocketContext<false,_true>::refusePayloadLength((ulong)payLength,wState,user);
  if (!bVar2) {
    uVar6 = payLength + 8;
    if (*length < uVar6) {
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe0;
      wState->remainingBytes = uVar6 - *length;
      bVar4 = **src;
      *(undefined4 *)wState->mask = *(undefined4 *)(*src + 4);
      WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::unmaskImprecise
                (*src,*src + 8,wState->mask,*length - 8);
      WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::rotateMask
                (4 - (*length & 3),wState->mask);
      WebSocketContext<false,_true>::handleFragment
                (*src,(ulong)(*length - 8),wState->remainingBytes,
                 (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                 (bool)(bVar4 >> 7),wState,user);
      return true;
    }
    pcVar7 = *src + 4;
    WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::unmaskImpreciseCopyMask
              (pcVar7,*src + 8,pcVar7,(uint)payLength);
    bVar2 = WebSocketContext<false,_true>::handleFragment
                      (*src + 4,(ulong)payLength,0,
                       (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                       (bool)((byte)**src >> 7),wState,user);
    if (!bVar2) {
      pcVar7 = *src;
      if (*pcVar7 < '\0') {
        *(byte *)&wState->state =
             *(byte *)&wState->state & 0x9f | *(byte *)&wState->state + 0x60 & 0x60;
        pcVar7 = *src;
      }
      *src = pcVar7 + uVar6;
      *length = *length - uVar6;
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe1;
      return false;
    }
    return true;
  }
LAB_0016ae82:
  us_socket_close(0,user);
  return true;
}

Assistant:

static inline bool consumeMessage(T payLength, char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (getOpCode(src)) {
            if (wState->state.opStack == 1 || (!wState->state.lastFin && getOpCode(src) < 2)) {
                Impl::forceClose(wState, user);
                return true;
            }
            wState->state.opCode[++wState->state.opStack] = (OpCode) getOpCode(src);
        } else if (wState->state.opStack == -1) {
            Impl::forceClose(wState, user);
            return true;
        }
        wState->state.lastFin = isFin(src);

        if (Impl::refusePayloadLength(payLength, wState, user)) {
            Impl::forceClose(wState, user);
            return true;
        }

        if (payLength + MESSAGE_HEADER <= length) {
            if (isServer) {
                unmaskImpreciseCopyMask(src + MESSAGE_HEADER - 4, src + MESSAGE_HEADER, src + MESSAGE_HEADER - 4, (unsigned int) payLength);
                if (Impl::handleFragment(src + MESSAGE_HEADER - 4, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            } else {
                if (Impl::handleFragment(src + MESSAGE_HEADER, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            }

            if (isFin(src)) {
                wState->state.opStack--;
            }

            src += payLength + MESSAGE_HEADER;
            length -= (unsigned int) (payLength + MESSAGE_HEADER);
            wState->state.spillLength = 0;
            return false;
        } else {
            wState->state.spillLength = 0;
            wState->state.wantsHead = false;
            wState->remainingBytes = (unsigned int) (payLength - length + MESSAGE_HEADER);
            bool fin = isFin(src);
            if (isServer) {
                memcpy(wState->mask, src + MESSAGE_HEADER - 4, 4);
                unmaskImprecise(src, src + MESSAGE_HEADER, wState->mask, length - MESSAGE_HEADER);
                rotateMask(4 - (length - MESSAGE_HEADER) % 4, wState->mask);
            } else {
                src += MESSAGE_HEADER;
            }
            Impl::handleFragment(src, length - MESSAGE_HEADER, wState->remainingBytes, wState->state.opCode[wState->state.opStack], fin, wState, user);
            return true;
        }
    }